

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019b200 = 0x2d2d2d2d2d2d2d;
    uRam000000000019b207._0_1_ = '-';
    uRam000000000019b207._1_1_ = '-';
    uRam000000000019b207._2_1_ = '-';
    uRam000000000019b207._3_1_ = '-';
    uRam000000000019b207._4_1_ = '-';
    uRam000000000019b207._5_1_ = '-';
    uRam000000000019b207._6_1_ = '-';
    uRam000000000019b207._7_1_ = '-';
    DAT_0019b1f0 = '-';
    DAT_0019b1f0_1._0_1_ = '-';
    DAT_0019b1f0_1._1_1_ = '-';
    DAT_0019b1f0_1._2_1_ = '-';
    DAT_0019b1f0_1._3_1_ = '-';
    DAT_0019b1f0_1._4_1_ = '-';
    DAT_0019b1f0_1._5_1_ = '-';
    DAT_0019b1f0_1._6_1_ = '-';
    uRam000000000019b1f8 = 0x2d2d2d2d2d2d2d;
    DAT_0019b1ff = 0x2d;
    DAT_0019b1e0 = '-';
    DAT_0019b1e0_1._0_1_ = '-';
    DAT_0019b1e0_1._1_1_ = '-';
    DAT_0019b1e0_1._2_1_ = '-';
    DAT_0019b1e0_1._3_1_ = '-';
    DAT_0019b1e0_1._4_1_ = '-';
    DAT_0019b1e0_1._5_1_ = '-';
    DAT_0019b1e0_1._6_1_ = '-';
    uRam000000000019b1e8._0_1_ = '-';
    uRam000000000019b1e8._1_1_ = '-';
    uRam000000000019b1e8._2_1_ = '-';
    uRam000000000019b1e8._3_1_ = '-';
    uRam000000000019b1e8._4_1_ = '-';
    uRam000000000019b1e8._5_1_ = '-';
    uRam000000000019b1e8._6_1_ = '-';
    uRam000000000019b1e8._7_1_ = '-';
    DAT_0019b1d0 = '-';
    DAT_0019b1d0_1._0_1_ = '-';
    DAT_0019b1d0_1._1_1_ = '-';
    DAT_0019b1d0_1._2_1_ = '-';
    DAT_0019b1d0_1._3_1_ = '-';
    DAT_0019b1d0_1._4_1_ = '-';
    DAT_0019b1d0_1._5_1_ = '-';
    DAT_0019b1d0_1._6_1_ = '-';
    uRam000000000019b1d8._0_1_ = '-';
    uRam000000000019b1d8._1_1_ = '-';
    uRam000000000019b1d8._2_1_ = '-';
    uRam000000000019b1d8._3_1_ = '-';
    uRam000000000019b1d8._4_1_ = '-';
    uRam000000000019b1d8._5_1_ = '-';
    uRam000000000019b1d8._6_1_ = '-';
    uRam000000000019b1d8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019b1c8._0_1_ = '-';
    uRam000000000019b1c8._1_1_ = '-';
    uRam000000000019b1c8._2_1_ = '-';
    uRam000000000019b1c8._3_1_ = '-';
    uRam000000000019b1c8._4_1_ = '-';
    uRam000000000019b1c8._5_1_ = '-';
    uRam000000000019b1c8._6_1_ = '-';
    uRam000000000019b1c8._7_1_ = '-';
    DAT_0019b20f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}